

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O3

bool crnlib::pixel_format_helpers::has_alpha(pixel_format fmt)

{
  if ((int)fmt < 0x41325445) {
    if ((int)fmt < 0x34545844) {
      if (((fmt != PIXEL_FMT_DXT5A) && (fmt != PIXEL_FMT_DXT2)) && (fmt != PIXEL_FMT_DXT3)) {
        return false;
      }
    }
    else if (((fmt != PIXEL_FMT_DXT4) && (fmt != PIXEL_FMT_DXT5)) && (fmt != PIXEL_FMT_DXT1A)) {
      return false;
    }
  }
  else if ((int)fmt < 0x41787878) {
    if (((fmt != PIXEL_FMT_ETC2A) && (fmt != PIXEL_FMT_A8R8G8B8)) && (fmt != PIXEL_FMT_A8L8)) {
      return false;
    }
  }
  else if (((fmt != PIXEL_FMT_A8) && (fmt != PIXEL_FMT_DXT5_AGBR)) && (fmt != PIXEL_FMT_ETC2AS)) {
    return false;
  }
  return true;
}

Assistant:

inline bool has_alpha(pixel_format fmt)
        {
            switch (fmt)
            {
            case PIXEL_FMT_DXT1A:
            case PIXEL_FMT_DXT2:
            case PIXEL_FMT_DXT3:
            case PIXEL_FMT_DXT4:
            case PIXEL_FMT_DXT5:
            case PIXEL_FMT_DXT5A:
            case PIXEL_FMT_A8R8G8B8:
            case PIXEL_FMT_A8:
            case PIXEL_FMT_A8L8:
            case PIXEL_FMT_DXT5_AGBR:
            case PIXEL_FMT_ETC2A:
            case PIXEL_FMT_ETC2AS:
                return true;
            default:
                break;
            }
            return false;
        }